

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::PresetOptionalBoolHelper
               (optional<bool> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)::helper == '\0'
     ) {
    iVar2 = __cxa_guard_acquire(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      PresetOptionalBoolHelper::helper.super__Function_base._M_functor._8_8_ = 0;
      PresetOptionalBoolHelper::helper.super__Function_base._M_functor._M_unused._M_object =
           PresetBoolHelper;
      PresetOptionalBoolHelper::helper._M_invoker =
           std::
           _Function_handler<bool_(std::optional<bool>_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:368:12)>
           ::_M_invoke;
      PresetOptionalBoolHelper::helper.super__Function_base._M_manager =
           std::
           _Function_handler<bool_(std::optional<bool>_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:368:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetOptionalBoolHelper::helper,
                   &__dso_handle);
      __cxa_guard_release(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::function<bool_(std::optional<bool>_&,_const_Json::Value_*,_cmJSONState_*)>::
          operator()(&PresetOptionalBoolHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool PresetOptionalBoolHelper(cm::optional<bool>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper =
    JSONHelperBuilder::Optional<bool>(PresetBoolHelper);
  return helper(out, value, state);
}